

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O1

void mahjong::adjust_by_waiting_form
               (pack_t *concealed_packs,intptr_t pack_cnt,tile_t *standing_tiles,
               intptr_t standing_cnt,tile_t win_tile,fan_table_t *fan_table)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  difference_type __n;
  long lVar10;
  long lVar11;
  bool *pbVar12;
  byte *pbVar13;
  byte bVar14;
  useful_table_t waiting_table;
  useful_table_t temp_table;
  useful_table_t useful_table;
  bool local_118 [80];
  byte local_c8 [80];
  bool local_78 [72];
  
  bVar14 = 0;
  if ((*fan_table)[5] == 0 && (*fan_table)[0x34] == 0) {
    bVar8 = is_basic_form_wait(standing_tiles,standing_cnt,(useful_table_t *)local_118);
    if (bVar8) {
      if ((pack_cnt == 5) &&
         (iVar9 = seven_pairs_shanten(standing_tiles,standing_cnt,&local_78), iVar9 == 0)) {
        pbVar12 = local_78;
        pbVar13 = local_c8;
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(undefined8 *)pbVar13 = *(undefined8 *)pbVar12;
          pbVar12 = pbVar12 + ((ulong)bVar14 * -2 + 1) * 8;
          pbVar13 = pbVar13 + ((ulong)bVar14 * -2 + 1) * 8;
        }
        lVar10 = 0;
        do {
          local_118[lVar10] = (bool)(local_118[lVar10] | local_c8[lVar10]);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x48);
      }
      lVar10 = 0;
      lVar11 = 0;
      do {
        lVar10 = lVar10 + (ulong)local_118[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x48);
      if (lVar10 == 1) {
        if (pack_cnt < 1) {
          bVar5 = false;
          bVar3 = false;
          bVar8 = false;
        }
        else {
          bVar4 = false;
          bVar2 = false;
          bVar5 = false;
          bVar3 = false;
          bVar8 = false;
          lVar10 = 0;
          bVar7 = false;
          do {
            uVar1 = concealed_packs[lVar10];
            bVar14 = (byte)uVar1;
            if (((byte)(uVar1 >> 8) & 0xf) == 4) {
              bVar8 = bVar2;
              bVar3 = bVar4;
              bVar5 = true;
              bVar6 = true;
              if (bVar14 != win_tile) {
                bVar5 = bVar7;
                bVar6 = bVar7;
              }
            }
            else {
              bVar6 = bVar7;
              if ((uVar1 >> 8 & 0xf) == 1) {
                bVar6 = bVar5;
                if (bVar14 == win_tile) {
                  bVar2 = bVar8;
                  bVar3 = true;
                  bVar4 = true;
                }
                else {
                  bVar2 = (bool)(bVar8 | (bVar14 - 1 == (uint)win_tile ||
                                         bVar14 + 1 == (uint)win_tile));
                  bVar8 = bVar2;
                  bVar4 = bVar3;
                }
              }
            }
            lVar10 = lVar10 + 1;
            bVar7 = bVar6;
          } while (pack_cnt != lVar10);
        }
        lVar10 = 0x9a;
        if (((bVar8) || (lVar10 = 0x9c, bVar3)) || (lVar10 = 0x9e, bVar5)) {
          *(undefined2 *)((long)*fan_table + lVar10) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void adjust_by_waiting_form(const pack_t *concealed_packs, intptr_t pack_cnt, const tile_t *standing_tiles, intptr_t standing_cnt,
    tile_t win_tile, fan_table_t &fan_table) {
    // 全求人和四杠不计单钓将，也不可能有边张、嵌张
    if (fan_table[MELDED_HAND] || fan_table[FOUR_KONGS]) {
        return;
    }

    useful_table_t waiting_table;  // 听牌标记表
    if (!is_basic_form_wait(standing_tiles, standing_cnt, &waiting_table)) {
        return;
    }

    if (pack_cnt == 5) {  // 门清状态
        // 判断是否为七对听牌
        useful_table_t temp_table;
        if (is_seven_pairs_wait(standing_tiles, standing_cnt, &temp_table)) {
            // 合并听牌标记表
            std::transform(std::begin(temp_table), std::end(temp_table), std::begin(waiting_table),
                std::begin(waiting_table), [](bool w, bool t) { return w || t; });
        }
    }

    // 统计听牌张数，听牌数大于1张，不计边张、嵌张、单钓将
    if (1 != std::count(std::begin(waiting_table), std::end(waiting_table), true)) {
        return;
    }

    // 听1张的情况，看和牌张处于什么位置
    // 边张0x01 嵌张0x02 单钓将0x04
    uint8_t pos_flag = 0;

    for (intptr_t i = 0; i < pack_cnt; ++i) {
        switch (pack_get_type(concealed_packs[i])) {
        case PACK_TYPE_CHOW: {
            tile_t mid_tile = pack_get_tile(concealed_packs[i]);
            if (mid_tile == win_tile) {
                pos_flag |= 0x02U;  // 嵌张
            }
            else if (mid_tile + 1 == win_tile || mid_tile - 1 == win_tile) {
                pos_flag |= 0x01U;  // 边张
            }
            break;
        }
        case PACK_TYPE_PAIR: {
            tile_t mid_tile = pack_get_tile(concealed_packs[i]);
            if (mid_tile == win_tile) {
                pos_flag |= 0x04U;  // 单钓将
            }
            break;
        }
        default:
            break;
        }
    }

    // 当多种可能存在时，只能计其中一种
    if (pos_flag & 0x01U) {
        fan_table[EDGE_WAIT] = 1;
    }
    else if (pos_flag & 0x02U) {
        fan_table[CLOSED_WAIT] = 1;
    }
    else if (pos_flag & 0x04U) {
        fan_table[SINGLE_WAIT] = 1;
    }
}